

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipstream.cpp
# Opt level: O2

void __thiscall ZipStream::ZipStream(ZipStream *this,string *zipName)

{
  unique_ptr<char[],_std::default_delete<char[]>_> *puVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  uint uVar4;
  size_t sVar5;
  pointer __p_00;
  long pos;
  ulong uVar6;
  ulong uVar7;
  pointer __p;
  undefined8 uVar8;
  File *this_00;
  int iVar9;
  char acStack_200b8 [8];
  char fileName [65536];
  undefined1 auStack_100b0 [8];
  EndOfCentralDir64 eocd64;
  undefined1 local_a6 [8];
  CentralDirEntry cd;
  ulong local_68;
  int64_t offset;
  size_t local_58;
  ZipStream *local_50;
  size_type local_48;
  unique_ptr<char[],_std::default_delete<char[]>_> *local_40;
  uint8_t *local_38;
  uint32_t flags;
  
  local_40 = &this->comment_;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->zipName_,(string *)zipName);
  this_00 = &this->f_;
  local_50 = this;
  File::File(this_00,zipName,READ);
  uVar8 = 0xffffffffffffffef;
  File::seek(this_00,-0x11,2);
  uVar4 = 0;
  for (iVar9 = -0x10008; (uVar4 != 0x6054b50 && (iVar9 != 0)); iVar9 = iVar9 + 1) {
    uVar8 = 0xfffffffffffffffb;
    File::seek(this_00,-5,1);
    uVar4 = File::Read<unsigned_int>(this_00);
  }
  if (iVar9 != 0) {
    sVar5 = File::tell(this_00);
    File::seek(this_00,4,1);
    uVar2 = File::Read<unsigned_short>(this_00);
    File::seek(this_00,2,1);
    File::Read<unsigned_int>(this_00);
    uVar4 = File::Read<unsigned_int>(this_00);
    uVar3 = File::Read<unsigned_short>(this_00);
    if (uVar3 != 0) {
      local_48 = CONCAT62(local_48._2_6_,uVar2);
      uVar6 = (ulong)uVar3;
      offset._4_4_ = uVar4;
      local_58 = sVar5;
      __p_00 = (pointer)operator_new__(uVar6 + 1);
      memset(__p_00,0,uVar6 + 1);
      puVar1 = local_40;
      auStack_100b0 = (undefined1  [8])0x0;
      std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)local_40,__p_00);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)auStack_100b0);
      File::Read<char>(this_00,(puVar1->_M_t).
                               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl,uVar6);
      (local_40->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar6] = '\0';
      sVar5 = local_58;
      uVar2 = (ushort)local_48;
      uVar4 = offset._4_4_;
    }
    if (uVar2 == 0xffff || uVar4 == 0xffffffff) {
      File::seek(this_00,sVar5 - 0x18,0);
      uVar4 = File::Read<unsigned_int>(this_00);
      if (uVar4 != 0x7064b50) {
        return;
      }
      File::seek(this_00,4,1);
      pos = File::Read<long>(this_00);
      File::seek(this_00,pos,0);
      File::Read<EndOfCentralDir64>((EndOfCentralDir64 *)auStack_100b0,this_00);
    }
    else {
      eocd64.diskentries = (uint64_t)uVar2;
      eocd64.cdsize = (int64_t)uVar4;
    }
    std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>::reserve
              (&local_50->entries_,eocd64.diskentries);
    File::seek(this_00,eocd64.cdsize,0);
    local_48 = eocd64.diskentries;
    if ((long)eocd64.diskentries < 1) {
      local_48 = 0;
    }
    cd._38_8_ = this_00;
    for (local_58 = 0; local_58 != local_48; local_58 = local_58 + 1) {
      File::Read<CentralDirEntry>((CentralDirEntry *)local_a6,this_00);
      sVar5 = File::Read<char[65536]>
                        (this_00,(char (*) [65536])acStack_200b8,(ulong)(ushort)cd.compSize);
      acStack_200b8[sVar5] = '\0';
      File::seek(this_00,(ushort)cd.compSize - sVar5,1);
      local_68 = (ulong)(uint)cd._34_4_;
      uVar4 = (uint)cd.compSize._2_2_;
      memset(auStack_100b0,0,0x10003);
      for (; 0 < (int)uVar4; uVar4 = (uVar4 - (ushort)auStack_100b0._2_2_) - 4) {
        File::Read<unsigned_char>(this_00,auStack_100b0,4);
        File::Read<unsigned_char>(this_00,auStack_100b0 + 4,(ulong)auStack_100b0 >> 0x10 & 0xffff);
        if (auStack_100b0._0_2_ == 0x7875) {
          local_38 = auStack_100b0 + 5;
          uVar6 = decodeInt(&local_38);
          uVar7 = decodeInt(&local_38);
          this_00 = (File *)cd._38_8_;
          printf("UID %x GID %x\n",uVar6 & 0xffffffff,uVar7 & 0xffffffff);
        }
        else if (auStack_100b0._0_2_ != 0x5455) {
          if (auStack_100b0._0_2_ == 1) {
            local_68._0_2_ = eocd64.v0;
            local_68._2_2_ = eocd64.v1;
            local_68._4_4_ = eocd64.disk;
          }
          else {
            printf("**Warning: Ignoring extra block %04x\n");
          }
        }
      }
      File::seek(this_00,(ulong)(ushort)cd.uncompSize,1);
      local_38 = (uint8_t *)((ulong)local_38 & 0xffffffff00000000);
      std::vector<ZipStream::Entry,std::allocator<ZipStream::Entry>>::
      emplace_back<char(&)[65536],long&,unsigned_int_const&>
                ((vector<ZipStream::Entry,std::allocator<ZipStream::Entry>> *)local_50,
                 (char (*) [65536])acStack_200b8,(long *)&local_68,(uint *)&local_38);
    }
    return;
  }
  File::close(this_00,(int)uVar8);
  return;
}

Assistant:

ZipStream::ZipStream(const std::string& zipName)
    : zipName_(zipName), f_{zipName}
{
    uint32_t id = 0;
    // Find CD by scanning backwards from end
    f_.seek(-22 + 5, SEEK_END);
    int counter = 64 * 1024 + 8;
    while (id != EndOfCD_SIG && counter > 0) {
        f_.seek(-5, SEEK_CUR);
        id = f_.Read<uint32_t>();
        counter--;
    }
    if (counter <= 0) {
        f_.close();
        return;
    }

    auto start = f_.tell();
    f_.seek(4, SEEK_CUR);
    int64_t entryCount = f_.Read<uint16_t>();
    f_.seek(2, SEEK_CUR);
    /* auto cdSize = */ f_.Read<uint32_t>();
    int64_t cdOffset = f_.Read<uint32_t>();
    auto commentLen = f_.Read<uint16_t>();
    if (commentLen > 0) {
        comment_ = std::make_unique<char[]>(commentLen + 1);
        f_.Read(comment_.get(), commentLen);
        comment_[commentLen] = 0;
    }

    if (entryCount == 0xffff || cdOffset == 0xffffffff) {
        // Find zip64 data
        f_.seek(start - 6 * 4, SEEK_SET);
        id = f_.Read<uint32_t>();
        if (id != EndOfCD64Locator_SIG) {
            return;
        }
        f_.seek(4, SEEK_CUR);
        auto cdStart = f_.Read<int64_t>();
        f_.seek(cdStart, SEEK_SET);
        auto eocd64 = f_.Read<EndOfCentralDir64>();

        cdOffset = eocd64.cdoffset;
        entryCount = eocd64.entries;
    }

    entries_.reserve(entryCount);

    f_.seek(cdOffset, SEEK_SET);
    char fileName[65536];
    for (auto i = 0L; i < entryCount; i++) {
        auto const cd = f_.Read<CentralDirEntry>();
        auto const rc = f_.Read(&fileName, cd.nameLen);
        fileName[rc] = 0;
        f_.seek(cd.nameLen - rc, SEEK_CUR);
        int64_t offset = cd.offset;
        int exLen = cd.exLen;
        Extra extra{};
        while (exLen > 0) {
            f_.Read((uint8_t*)&extra, 4);
            f_.Read(extra.data, extra.size);
            if (extra.id == 0x01) {
                offset = extra.zip64.offset;
            } else if (extra.id == 0x7875) {
                auto const* ptr = &extra.data[1];
                uint32_t const uid = decodeInt(&ptr);
                uint32_t const gid = decodeInt(&ptr);
                printf("UID %x GID %x\n", uid, gid);
            } else if (extra.id == 0x5455) {
                // TODO: Read timestamps
            } else
                printf("**Warning: Ignoring extra block %04x\n", extra.id);

            exLen -= (extra.size + 4);
        }

        f_.seek(cd.commLen, SEEK_CUR);
        auto const flags = ((cd.attr1 & (S_IFREG >> 16)) == 0)
                               ? // Some archives have broken attributes
                               0
                               : cd.attr1 >> 16;
        entries_.emplace_back(fileName, offset, flags);
    }
}